

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O0

LPVOID VIRTUALReserveMemory
                 (CPalThread *pthrCurrent,LPVOID lpAddress,SIZE_T dwSize,DWORD flAllocationType,
                 DWORD flProtect)

{
  BOOL BVar1;
  SIZE_T local_40;
  SIZE_T MemSize;
  UINT_PTR StartBoundary;
  LPVOID pRetVal;
  DWORD flProtect_local;
  DWORD flAllocationType_local;
  SIZE_T dwSize_local;
  LPVOID lpAddress_local;
  CPalThread *pthrCurrent_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  MemSize = (ulong)lpAddress & 0xffffffffffff0000;
  local_40 = ((long)lpAddress + dwSize + 0xfff & 0xfffffffffffff000) - MemSize;
  if ((flAllocationType & 0x40000000) != 0) {
    fprintf(_stderr,"MEM_RESERVE_EXECUTABLE is not supported!");
    abort();
  }
  CorUnix::InternalEnterCriticalSection(pthrCurrent,&virtual_critsec);
  StartBoundary = (UINT_PTR)ReserveVirtualMemory(pthrCurrent,(LPVOID)MemSize,local_40);
  if ((LPVOID)StartBoundary != (LPVOID)0x0) {
    if (lpAddress == (LPVOID)0x0) {
      MemSize = StartBoundary & 0xfffffffffffff000;
      local_40 = (StartBoundary + dwSize + 0xfff & 0xfffffffffffff000) - MemSize;
    }
    BVar1 = VIRTUALStoreAllocationInfo(MemSize,local_40,flAllocationType,flProtect);
    if (BVar1 == 0) {
      fprintf(_stderr,"] %s %s:%d","VIRTUALReserveMemory",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
              ,0x401);
      fprintf(_stderr,"Unable to store the structure in the list.\n");
      CorUnix::CPalThread::SetLastError(0x54f);
      munmap((void *)StartBoundary,local_40);
      StartBoundary = 0;
    }
  }
  CorUnix::InternalLeaveCriticalSection(pthrCurrent,&virtual_critsec);
  return (LPVOID)StartBoundary;
}

Assistant:

static LPVOID VIRTUALReserveMemory(
                IN CPalThread *pthrCurrent, /* Currently executing thread */
                IN LPVOID lpAddress,        /* Region to reserve or commit */
                IN SIZE_T dwSize,           /* Size of Region */
                IN DWORD flAllocationType,  /* Type of allocation */
                IN DWORD flProtect)         /* Type of access protection */
{
    LPVOID pRetVal      = NULL;
    UINT_PTR StartBoundary;
    SIZE_T MemSize;

    TRACE( "Reserving the memory now..\n");

    // First, figure out where we're trying to reserve the memory and
    // how much we need. On most systems, requests to mmap must be
    // page-aligned and at multiples of the page size.
    StartBoundary = (UINT_PTR)lpAddress & ~BOUNDARY_64K;
    /* Add the sizes, and round down to the nearest page boundary. */
    MemSize = ( ((UINT_PTR)lpAddress + dwSize + VIRTUAL_PAGE_MASK) & ~VIRTUAL_PAGE_MASK ) -
               StartBoundary;

    if ((flAllocationType & MEM_RESERVE_EXECUTABLE) != 0)
    {
        fprintf(stderr, "MEM_RESERVE_EXECUTABLE is not supported!");
        abort();
    }

    InternalEnterCriticalSection(pthrCurrent, &virtual_critsec);

    if (pRetVal == NULL)
    {
        // Try to reserve memory from the OS
        pRetVal = ReserveVirtualMemory(pthrCurrent, (LPVOID)StartBoundary, MemSize);
    }

    if (pRetVal != NULL)
    {
#if !MMAP_IGNORES_HINT
        if ( !lpAddress )
        {
#endif  // MMAP_IGNORES_HINT
            /* Compute the real values instead of the null values. */
            StartBoundary = (UINT_PTR)pRetVal & ~VIRTUAL_PAGE_MASK;

            MemSize = ( ((UINT_PTR)pRetVal + dwSize + VIRTUAL_PAGE_MASK) & ~VIRTUAL_PAGE_MASK ) -
                      StartBoundary;
#if !MMAP_IGNORES_HINT
        }
#endif  // MMAP_IGNORES_HINT
        if ( !VIRTUALStoreAllocationInfo( StartBoundary, MemSize,
                                   flAllocationType, flProtect ) )
        {
            ASSERT( "Unable to store the structure in the list.\n");
            pthrCurrent->SetLastError( ERROR_INTERNAL_ERROR );
            munmap( pRetVal, MemSize );
            pRetVal = NULL;
        }
    }

    InternalLeaveCriticalSection(pthrCurrent, &virtual_critsec);
    return pRetVal;
}